

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O0

NLW2_SOLReadResultCode mp::Read<int>(FILE *f,int binary,pair<int,_int> *v,string *err)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  ulong in_RCX;
  undefined4 *in_RDX;
  int in_ESI;
  FILE *in_RDI;
  double dVar5;
  double el;
  char *se;
  char *s;
  char *local_38;
  char *local_30;
  undefined4 *local_20;
  int local_14;
  FILE *local_10;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  std::__cxx11::string::resize(in_RCX);
  if (local_14 == 0) {
    pcVar3 = (char *)std::__cxx11::string::data();
    iVar1 = std::__cxx11::string::size();
    pcVar3 = fgets(pcVar3,iVar1 + -1,local_10);
    if (pcVar3 == (char *)0x0) {
      return NLW2_SOLRead_Early_EOF;
    }
    local_30 = (char *)std::__cxx11::string::c_str();
    lVar4 = strtol(local_30,&local_38,10);
    *local_20 = (int)lVar4;
    if (local_38 <= local_30) {
      return NLW2_SOLRead_Bad_Line;
    }
    local_30 = local_38;
    dVar5 = strtod(local_38,&local_38);
    if (local_38 <= local_30) {
      return NLW2_SOLRead_Bad_Line;
    }
    local_20[1] = (int)dVar5;
  }
  else {
    sVar2 = fread(local_20,4,1,local_10);
    if ((sVar2 != 1) || (sVar2 = fread(local_20 + 1,4,1,local_10), sVar2 != 1)) {
      return NLW2_SOLRead_Early_EOF;
    }
  }
  return NLW2_SOLRead_OK;
}

Assistant:

inline NLW2_SOLReadResultCode Read(
    FILE* f, int binary,
    std::pair<int, El>& v, std::string& err) {
  err.resize(512);
  if (binary) {
    if (fread(&v.first, sizeof(int), 1, f) != 1
        || fread(&v.second, sizeof(El), 1, f) != 1)
      return NLW2_SOLRead_Early_EOF;
  } else {
    if (!fgets((char*)err.data(), err.size()-1, f))
      return NLW2_SOLRead_Early_EOF;
    const char *s;
    char *se;
    v.first = (int)strtol(s = err.c_str(), &se, 10);
    if (se <= s)
      return NLW2_SOLRead_Bad_Line;
    auto el = strtod(s = se, &se);
    if (se <= s)
      return NLW2_SOLRead_Bad_Line;
    v.second = (El)el;
  }
  return NLW2_SOLRead_OK;
}